

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movDemuxer.cpp
# Opt level: O0

int __thiscall MovDemuxer::mov_read_trex(MovDemuxer *this,MOVAtom atom)

{
  uint uVar1;
  size_type sVar2;
  reference pvVar3;
  MOVTrackExt *trex;
  MovDemuxer *this_local;
  
  std::vector<MovDemuxer::MOVTrackExt,_std::allocator<MovDemuxer::MOVTrackExt>_>::emplace_back<>
            (&this->trex_data);
  sVar2 = std::vector<MovDemuxer::MOVTrackExt,_std::allocator<MovDemuxer::MOVTrackExt>_>::size
                    (&this->trex_data);
  pvVar3 = std::vector<MovDemuxer::MOVTrackExt,_std::allocator<MovDemuxer::MOVTrackExt>_>::
           operator[](&this->trex_data,sVar2 - 1);
  IOContextDemuxer::get_byte(&this->super_IOContextDemuxer);
  IOContextDemuxer::get_be24(&this->super_IOContextDemuxer);
  uVar1 = IOContextDemuxer::get_be32(&this->super_IOContextDemuxer);
  pvVar3->track_id = uVar1;
  uVar1 = IOContextDemuxer::get_be32(&this->super_IOContextDemuxer);
  pvVar3->stsd_id = uVar1;
  uVar1 = IOContextDemuxer::get_be32(&this->super_IOContextDemuxer);
  pvVar3->duration = uVar1;
  uVar1 = IOContextDemuxer::get_be32(&this->super_IOContextDemuxer);
  pvVar3->size = uVar1;
  uVar1 = IOContextDemuxer::get_be32(&this->super_IOContextDemuxer);
  pvVar3->flags = uVar1;
  return 0;
}

Assistant:

int MovDemuxer::mov_read_trex(MOVAtom atom)
{
    trex_data.emplace_back();
    MOVTrackExt& trex = trex_data[trex_data.size() - 1];
    get_byte();  // version
    get_be24();  // flags
    trex.track_id = static_cast<int>(get_be32());
    trex.stsd_id = get_be32();
    trex.duration = get_be32();
    trex.size = get_be32();
    trex.flags = get_be32();
    return 0;
}